

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.cpp
# Opt level: O2

int coda_get_header_buf(coda_header_t *header,char *s,size_t len)

{
  char *pcVar1;
  char *pcVar2;
  mapped_type *pmVar3;
  char *pcVar4;
  int iVar5;
  string key;
  
  if (s == (char *)0x0) {
    iVar5 = -1;
  }
  else {
    pcVar4 = s + len;
    while (iVar5 = 0, s < pcVar4) {
      pcVar1 = coda_strnstr(s,"\r\n",(long)pcVar4 - (long)s);
      if (pcVar1 == (char *)0x0) {
        pcVar1 = pcVar4;
      }
      if (pcVar1 == s) {
        return 0;
      }
      pcVar2 = coda_strnchr(s,':',(long)pcVar4 - (long)s);
      if (pcVar2 < pcVar1 && pcVar2 != (char *)0x0) {
        key._M_dataplus._M_p = (pointer)&key.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&key,s,pcVar2);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](header,&key);
        std::__cxx11::string::assign((char *)pmVar3,(ulong)(pcVar2 + 1));
        std::__cxx11::string::~string((string *)&key);
      }
      s = pcVar1 + 2;
    }
  }
  return iVar5;
}

Assistant:

int coda_get_header_buf(coda_header_t& header, const char* s, size_t len)
{
	if (!s) return -1;

	const char* e = s + len;

	while (s < e)
	{
		const char* crlf = coda_strnstr(s, "\r\n", e - s);
		if (NULL == crlf) crlf = e;
		if (crlf == s) break; /* \r\n\r\n situation, end of headers */

		const char* dodo = coda_strnchr(s, ':', e - s);
		if (NULL != dodo && dodo < crlf)
		{
			std::string key (s, dodo - s);
			header[key].assign(dodo + 1, crlf - dodo - 1);
		}

		s = crlf + 2;
	}

	return 0;
}